

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O3

ON_Font * ON_Font::InstalledFontFromRichTextProperties
                    (wchar_t *rtf_font_name,bool bRtfBold,bool bRtfItalic)

{
  wchar_t wVar1;
  bool bVar2;
  wchar_t *windows_logfont_name;
  ON_Font *this;
  wchar_t *family_name_00;
  wchar_t *prefered_face_name;
  ON_Font *pOVar3;
  Weight prefered_weight;
  ulong uVar4;
  wchar_t *s;
  Style prefered_style;
  ON_wString local_rtf_font_name;
  ON_wString face_name;
  ON_wString family_name;
  wchar_t hyphen [2];
  
  ON_wString::ON_wString(&local_rtf_font_name,rtf_font_name);
  ON_wString::TrimLeftAndRight(&local_rtf_font_name,(wchar_t *)0x0);
  bVar2 = ON_wString::IsEmpty(&local_rtf_font_name);
  if (bVar2) {
    RichTextFontName((ON_Font *)hyphen,&Default,false);
    ON_wString::operator=(&local_rtf_font_name,(ON_wString *)hyphen);
    ON_wString::~ON_wString((ON_wString *)hyphen);
  }
  windows_logfont_name = ON_wString::operator_cast_to_wchar_t_(&local_rtf_font_name);
  ON_ManagedFonts::InstalledFonts();
  prefered_weight = bRtfBold + Medium;
  prefered_style = bRtfItalic + Upright;
  this = ON_FontList::Internal_FromNames
                   (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,windows_logfont_name,
                    (wchar_t *)0x0,(wchar_t *)0x0,prefered_weight,Unset,prefered_style,true,false,
                    true,false,false,0.0);
  if (this == (ON_Font *)0x0) {
    ON_ManagedFonts::InstalledFonts();
    this = ON_FontList::Internal_FromNames
                     (&ON_ManagedFonts::List.m_installed_fonts,windows_logfont_name,(wchar_t *)0x0,
                      (wchar_t *)0x0,(wchar_t *)0x0,prefered_weight,Unset,prefered_style,true,false,
                      true,false,false,0.0);
    if (this == (ON_Font *)0x0) {
      hyphen[0] = L'-';
      hyphen[1] = L'\0';
      s = windows_logfont_name + 2;
      uVar4 = 4;
      do {
        wVar1 = s[-1];
        if ((wVar1 == L' ') || (wVar1 == L'-')) {
          ON_wString::ON_wString(&family_name,windows_logfont_name,(int)(uVar4 >> 2));
          ON_wString::TrimLeftAndRight(&family_name,(wchar_t *)0x0);
          ON_wString::TrimLeftAndRight(&family_name,hyphen);
          ON_wString::TrimLeftAndRight(&family_name,(wchar_t *)0x0);
          bVar2 = ON_wString::IsEmpty(&family_name);
          if (!bVar2) {
            ON_wString::ON_wString(&face_name,s);
            ON_wString::TrimLeftAndRight(&face_name,(wchar_t *)0x0);
            ON_wString::TrimLeftAndRight(&face_name,hyphen);
            ON_wString::TrimLeftAndRight(&face_name,(wchar_t *)0x0);
            bVar2 = ON_wString::IsEmpty(&face_name);
            if (!bVar2) {
              ON_ManagedFonts::InstalledFonts();
              family_name_00 = ON_wString::operator_cast_to_wchar_t_(&family_name);
              prefered_face_name = ON_wString::operator_cast_to_wchar_t_(&face_name);
              this = ON_FontList::Internal_FromNames
                               (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,
                                (wchar_t *)0x0,family_name_00,prefered_face_name,prefered_weight,
                                Unset,prefered_style,true,false,true,false,false,0.0);
              if (this != (ON_Font *)0x0) {
                ON_wString::~ON_wString(&face_name);
                ON_wString::~ON_wString(&family_name);
                break;
              }
            }
            ON_wString::~ON_wString(&face_name);
          }
          ON_wString::~ON_wString(&family_name);
        }
        else if (wVar1 == L'\0') goto LAB_00479a5c;
        s = s + 1;
        uVar4 = uVar4 + 4;
      } while( true );
    }
  }
LAB_00479ac0:
  InstalledFontQuartet((ON_FontFaceQuartet *)hyphen,this);
  pOVar3 = ON_FontFaceQuartet::ClosestFace((ON_FontFaceQuartet *)hyphen,bRtfBold,bRtfItalic);
  if (pOVar3 != (ON_Font *)0x0) {
    this = pOVar3;
  }
  ON_wString::~ON_wString((ON_wString *)hyphen);
LAB_00479af3:
  ON_wString::~ON_wString(&local_rtf_font_name);
  return this;
LAB_00479a5c:
  ON_ManagedFonts::InstalledFonts();
  this = ON_FontList::Internal_FromNames
                   (&ON_ManagedFonts::List.m_installed_fonts,(wchar_t *)0x0,(wchar_t *)0x0,
                    windows_logfont_name,(wchar_t *)0x0,prefered_weight,Unset,prefered_style,true,
                    false,true,false,false,0.0);
  if (this == (ON_Font *)0x0) {
    this = (ON_Font *)0x0;
    goto LAB_00479af3;
  }
  goto LAB_00479ac0;
}

Assistant:

const ON_Font* ON_Font::InstalledFontFromRichTextProperties(
  const wchar_t* rtf_font_name,
  bool bRtfBold,
  bool bRtfItalic
)
{
  ON_wString local_rtf_font_name(rtf_font_name);
  local_rtf_font_name.TrimLeftAndRight();
  if (local_rtf_font_name.IsEmpty())
    local_rtf_font_name = ON_Font::Default.RichTextFontName();
  rtf_font_name = local_rtf_font_name;

  // It is critical that bRequireFaceMatch because the input name must
  // clearly identify a font in some way. The search below allows for this
  // name to appear in various contexts (LOGFONT, PostScript, Family+Face, Family).
  const bool bRequireFaceMatch = true;

  // It is critical that bRequireStyleMatch = false. See below
  const bool bRequireStyleMatch = false;

  // The preferred_weight is a bias used to pick between faces that have matching name properties.
  // An exact match is not required because bRequireStyleMatch = false;
  const ON_Font::Weight preferred_weight = bRtfBold ? ON_Font::Weight::Semibold : ON_Font::Weight::Medium;

  // The preferred_style is a bias used to pick between faces that have matching name properties.
  // An exact match is not required because bRequireStyleMatch = false;
  const ON_Font::Style preferred_style = bRtfItalic ? ON_Font::Style::Italic : ON_Font::Style::Upright;

  const bool bUnderlined = false;
  const bool bStrikethrough = false;
  const wchar_t* ignore_postscript_name = nullptr;
  const wchar_t* ignore_windows_logfont_name = nullptr;
  const wchar_t* ignore_family_name = nullptr;
  const wchar_t* ignore_prefered_face_name = nullptr;


  // 1st: Try LOGFONT name. For Windows this is the very best choice.
  // For MacOS this works the best in practice. If it fails, we move onto PostScript.
  const ON_Font* installed_font = ON_Font::InstalledFontList().FromNames(
    ignore_postscript_name,
    rtf_font_name, // windows_logfont_name,
    ignore_family_name,
    ignore_prefered_face_name,
    preferred_weight, ON_Font::Stretch::Unset, preferred_style,
    bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
    0.0
  );

  while (nullptr == installed_font)
  {

    // 2nd: Try PostScript name
    installed_font = ON_Font::InstalledFontList().FromNames(
      rtf_font_name, // postscript_name,
      ignore_windows_logfont_name,
      ignore_family_name,
      ignore_prefered_face_name,
      preferred_weight, ON_Font::Stretch::Unset, preferred_style,
      bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
      0.0
    );
    if (nullptr != installed_font)
      break;

    // 3rd: Try Family + Face name
    const wchar_t hyphen[2] = {ON_wString::HyphenMinus,0};
    for (const wchar_t* separator = rtf_font_name + 1; 0 != *separator; ++separator)
    {
      if (ON_wString::Space != *separator && ON_wString::HyphenMinus != *separator)
        continue;
      ON_wString family_name(rtf_font_name, (int)(separator - rtf_font_name));
      family_name.TrimLeftAndRight();
      family_name.TrimLeftAndRight(hyphen);
      family_name.TrimLeftAndRight();
      if (family_name.IsEmpty())
        continue;
      ON_wString face_name(separator + 1);
      face_name.TrimLeftAndRight();
      face_name.TrimLeftAndRight(hyphen);
      face_name.TrimLeftAndRight();
      if (face_name.IsEmpty())
        continue;

      installed_font = ON_Font::InstalledFontList().FromNames(
        ignore_postscript_name,
        ignore_windows_logfont_name,
        family_name, face_name,
        preferred_weight, ON_Font::Stretch::Unset, preferred_style,
        bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
        0.0
      );
      if (nullptr != installed_font)
        break;
    }
    if (nullptr != installed_font)
      break;


    // 4th: Try Family name
    installed_font = ON_Font::InstalledFontList().FromNames(
      ignore_postscript_name,
      ignore_windows_logfont_name,
      rtf_font_name, // family name
      ignore_prefered_face_name,
      preferred_weight, ON_Font::Stretch::Unset, preferred_style,
      bRequireFaceMatch, bRequireStyleMatch, bUnderlined, bStrikethrough,
      0.0
    );
    if (nullptr != installed_font)
      break;

    // No installed font comes close to matching the input name parameter 
    break;
  }

  if (nullptr != installed_font)
  {
    const ON_FontFaceQuartet q = installed_font->InstalledFontQuartet(); // only look at installed quartet!
    const ON_Font* f = q.ClosestFace(bRtfBold, bRtfItalic);
    return (nullptr != f) ? f : installed_font;
  }

  return nullptr;
}